

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::LoadableGetStateBlock_x
          (ChElementHexaANCF_3813_9 *this,int block_offset,ChState *mD)

{
  int iVar1;
  long lVar2;
  undefined4 in_register_00000034;
  long start;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_80;
  undefined8 local_70;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_68;
  
  local_70 = CONCAT44(in_register_00000034,block_offset);
  start = (long)block_offset;
  for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 0x10) {
    local_80.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_data = (PointerType)
              (*(long *)((long)&(((this->m_nodes).
                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + lVar2) + 0x20);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_68,&mD->super_ChVectorDynamic<double>,start,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_80
              );
    start = start + 3;
  }
  iVar1 = (int)local_70;
  local_80.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           &(((this->m_central_node).
              super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_ChNodeFEAbase).field_0x20;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(iVar1 + 0x18),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_80);
  local_80.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((this->m_central_node).
             super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_ryy).m_data;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(iVar1 + 0x1b),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_80);
  local_80.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (((this->m_central_node).
             super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_rzz).m_data;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(iVar1 + 0x1e),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_80);
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::LoadableGetStateBlock_x(int block_offset, ChState& mD) {
    for (int i = 0; i < 8; i++) {
        mD.segment(block_offset + 3 * i, 3) = m_nodes[i]->GetPos().eigen();
    }
    mD.segment(block_offset + 24, 3) = m_central_node->GetCurvatureXX().eigen();
    mD.segment(block_offset + 27, 3) = m_central_node->GetCurvatureYY().eigen();
    mD.segment(block_offset + 30, 3) = m_central_node->GetCurvatureZZ().eigen();
}